

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_CHALLENGE_HANDLE sasl_challenge_clone(SASL_CHALLENGE_HANDLE value)

{
  AMQP_VALUE pAVar1;
  SASL_CHALLENGE_HANDLE local_18;
  SASL_CHALLENGE_INSTANCE *sasl_challenge_instance;
  SASL_CHALLENGE_HANDLE value_local;
  
  local_18 = (SASL_CHALLENGE_HANDLE)malloc(8);
  if (local_18 != (SASL_CHALLENGE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (SASL_CHALLENGE_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

SASL_CHALLENGE_HANDLE sasl_challenge_clone(SASL_CHALLENGE_HANDLE value)
{
    SASL_CHALLENGE_INSTANCE* sasl_challenge_instance = (SASL_CHALLENGE_INSTANCE*)malloc(sizeof(SASL_CHALLENGE_INSTANCE));
    if (sasl_challenge_instance != NULL)
    {
        sasl_challenge_instance->composite_value = amqpvalue_clone(((SASL_CHALLENGE_INSTANCE*)value)->composite_value);
        if (sasl_challenge_instance->composite_value == NULL)
        {
            free(sasl_challenge_instance);
            sasl_challenge_instance = NULL;
        }
    }

    return sasl_challenge_instance;
}